

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O0

int __thiscall ncnn::Embed::forward(Embed *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  size_t sVar2;
  float *__dest;
  int *piVar3;
  float *pfVar4;
  int iVar5;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  int p;
  float *em;
  int word_index;
  float *outptr;
  int q;
  int words;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  Allocator *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar6;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int y;
  int local_4;
  
  sVar2 = Mat::total(in_RSI);
  iVar5 = (int)sVar2;
  Mat::create((Mat *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
              (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),(int)in_stack_ffffffffffffffc8,
              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8);
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (bVar1) {
    local_4 = -100;
  }
  else {
    for (y = 0; y < iVar5; y = y + 1) {
      __dest = Mat::row(in_RDX,y);
      piVar3 = Mat::operator_cast_to_int_(in_RSI);
      iVar6 = piVar3[y];
      if (iVar6 < 0) {
        iVar6 = 0;
      }
      if (*(int *)(in_RDI + 0x84) <= iVar6) {
        iVar6 = *(int *)(in_RDI + 0x84) + -1;
      }
      pfVar4 = Mat::operator_cast_to_float_((Mat *)(in_RDI + 0x90));
      memcpy(__dest,pfVar4 + *(int *)(in_RDI + 0x80) * iVar6,(long)*(int *)(in_RDI + 0x80) << 2);
      if (*(int *)(in_RDI + 0x88) != 0) {
        for (iVar6 = 0; iVar6 < *(int *)(in_RDI + 0x80); iVar6 = iVar6 + 1) {
          pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0xd0),iVar6);
          __dest[iVar6] = *pfVar4 + __dest[iVar6];
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Embed::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int words = bottom_blob.total();

    top_blob.create(num_output, words, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<words; q++)
    {
        float* outptr = top_blob.row(q);

        int word_index = ((const int*)bottom_blob)[q];

        if (word_index < 0)
            word_index = 0;
        if (word_index >= input_dim)
            word_index = input_dim - 1;

        const float* em = (const float*)weight_data + num_output * word_index;

        memcpy(outptr, em, num_output * sizeof(float));

        if (bias_term)
        {
            for (int p=0; p<num_output; p++)
            {
                outptr[p] += bias_data[p];
            }
        }
    }

    return 0;
}